

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APISetLogMessageMinimumLevel(hrgls_API api,hrgls_MessageLevel level)

{
  hrgls_MessageLevel level_local;
  hrgls_API api_local;
  
  if (api == (hrgls_API)0x0) {
    api_local._4_4_ = 0x3ee;
  }
  else {
    api_local._4_4_ = hrgls::API::SetLogMessageMinimumLevel(api->api,level);
  }
  return api_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APISetLogMessageMinimumLevel(hrgls_API api, hrgls_MessageLevel level)
  {
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    try {
      return api->api->SetLogMessageMinimumLevel(level);
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }